

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression * slang::ast::AssertionInstanceExpression::makeDefault(Symbol *symbol)

{
  Symbol *pSVar1;
  opt_storage<const_slang::ast::Symbol_*> *poVar2;
  group_type_pointer pgVar3;
  char *pcVar4;
  undefined4 uVar5;
  Scope *pSVar6;
  Compilation *this;
  opt_storage<const_slang::ast::Symbol_*> formal;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  AssertionInstanceExpression *pAVar12;
  AssertionExpr *args_2;
  undefined4 extraout_var;
  value_type *elements;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  iterator __begin2;
  opt_storage<const_slang::ast::Symbol_*> *poVar13;
  value_type_pointer ppVar14;
  SyntaxKind typeKind;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  PropertySymbol *prop;
  ulong uVar19;
  value_type_pointer ppVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  LookupLocation LVar27;
  try_emplace_args_t local_1e9;
  SourceLocation local_1e8;
  Type *local_1e0;
  PropertyExprSyntax *local_1d8;
  value_type_pointer local_1d0;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  locator res_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  AssertionInstanceDetails instance;
  SourceRange range;
  undefined1 local_68 [24];
  char acStack_50 [8];
  undefined1 local_48 [16];
  AssertionInstanceDetails *local_38;
  
  pSVar6 = symbol->parentScope;
  LVar27 = LookupLocation::before(symbol);
  local_68._8_4_ = LVar27.index;
  stack0xffffffffffffffa8 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (AssertionInstanceDetails *)0x0;
  this = pSVar6->compilation;
  local_68._0_8_ = pSVar6;
  if (symbol->kind == LetDecl) {
    local_1e0 = this->voidType;
  }
  else {
    if (symbol->kind == Property) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    local_1e0 = Compilation::getType(this,typeKind);
  }
  poVar13 = (opt_storage<const_slang::ast::Symbol_*> *)symbol[1].originatingSyntax;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.groups_size_index = 0x3f;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.groups_size_mask = 1;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  ppVar14 = instance.argumentMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .arrays.elements_;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .size_ctrl.ml = 0;
  pSVar1 = symbol + 1;
  local_1e8 = (SourceLocation)0x0;
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .size_ctrl.size = 0;
  instance.localVars.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  instance.localVars.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_mask = 1;
  instance.localVars.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
  .arrays._16_16_ = ZEXT816(0x9543d0);
  instance.localVars.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.ml = 0;
  instance._112_9_ = SUB169((undefined1  [16])0x0,0);
  instance.argExpansionLoc._1_7_ = 0;
  instance._128_9_ = SUB169((undefined1  [16])0x0,7);
  instance.prevContext = (ASTContext *)local_68;
  instance.symbol = symbol;
  instance.instanceLoc = symbol->location;
  if (*(long *)(symbol + 2) != 0) {
    poVar2 = poVar13 + *(long *)(symbol + 2);
    local_1e8 = (SourceLocation)0x0;
    ppVar20 = (value_type_pointer)symbol;
    do {
      auVar25 = local_48;
      auVar8 = stack0xffffffffffffffa8;
      formal = (opt_storage<const_slang::ast::Symbol_*>)poVar13->t_;
      if (*(PropertyExprSyntax **)(formal.t_ + 2) == (PropertyExprSyntax *)0x0) {
        localVars.stackBase._16_8_ = local_38;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             CONCAT44(local_68._12_4_,local_68._8_4_);
        localVars.stackBase[0] = local_48[0];
        localVars.stackBase[1] = local_48[1];
        localVars.stackBase[2] = local_48[2];
        localVars.stackBase[3] = local_48[3];
        localVars.stackBase[4] = local_48[4];
        localVars.stackBase[5] = local_48[5];
        localVars.stackBase[6] = local_48[6];
        localVars.stackBase[7] = local_48[7];
        localVars.stackBase[8] = local_48[8];
        localVars.stackBase[9] = local_48[9];
        localVars.stackBase[10] = local_48[10];
        localVars.stackBase[0xb] = local_48[0xb];
        localVars.stackBase[0xc] = local_48[0xc];
        localVars.stackBase[0xd] = local_48[0xd];
        localVars.stackBase[0xe] = local_48[0xe];
        localVars.stackBase[0xf] = local_48[0xf];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = local_68._16_8_;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = acStack_50[0];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = acStack_50[1];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = acStack_50[2];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = acStack_50[3];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = acStack_50[4];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = acStack_50[5];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = acStack_50[6];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = acStack_50[7];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)local_68._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = formal;
        uVar15 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar11 = uVar15 >> ((byte)instance.argumentMap.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        localVars.stackBase[0x18] = '\0';
        localVars.stackBase[0x19] = '\0';
        localVars.stackBase[0x1a] = '\0';
        localVars.stackBase[0x1b] = '\0';
        localVars.stackBase[0x1c] = '\0';
        localVars.stackBase[0x1d] = '\0';
        localVars.stackBase[0x1e] = '\0';
        localVars.stackBase[0x1f] = '\0';
        uVar5 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        local_1d8 = (PropertyExprSyntax *)
                    instance.argumentMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .arrays.groups_size_mask;
        uVar17 = uVar11;
        ppVar14 = (value_type_pointer)0x0;
        do {
          local_1d0 = ppVar14;
          pgVar3 = instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_ + uVar17;
          uVar21 = (uchar)uVar5;
          auVar26[0] = -(pgVar3->m[0].n == uVar21);
          uVar22 = (uchar)((uint)uVar5 >> 8);
          auVar26[1] = -(pgVar3->m[1].n == uVar22);
          uVar23 = (uchar)((uint)uVar5 >> 0x10);
          auVar26[2] = -(pgVar3->m[2].n == uVar23);
          uVar24 = (uchar)((uint)uVar5 >> 0x18);
          auVar26[3] = -(pgVar3->m[3].n == uVar24);
          auVar26[4] = -(pgVar3->m[4].n == uVar21);
          auVar26[5] = -(pgVar3->m[5].n == uVar22);
          auVar26[6] = -(pgVar3->m[6].n == uVar23);
          auVar26[7] = -(pgVar3->m[7].n == uVar24);
          auVar26[8] = -(pgVar3->m[8].n == uVar21);
          auVar26[9] = -(pgVar3->m[9].n == uVar22);
          auVar26[10] = -(pgVar3->m[10].n == uVar23);
          auVar26[0xb] = -(pgVar3->m[0xb].n == uVar24);
          auVar26[0xc] = -(pgVar3->m[0xc].n == uVar21);
          auVar26[0xd] = -(pgVar3->m[0xd].n == uVar22);
          auVar26[0xe] = -(pgVar3->m[0xe].n == uVar23);
          auVar26[0xf] = -(pgVar3->m[0xf].n == uVar24);
          for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
              uVar18 = uVar18 - 1 & uVar18) {
            uVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if ((AssertionPortSymbol *)formal.t_ ==
                (AssertionPortSymbol *)
                instance.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_[uVar17 * 0xf + (ulong)uVar7].first) {
              ppVar20 = instance.argumentMap.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                        .arrays.elements_ + uVar17 * 0xf + (ulong)uVar7;
              goto LAB_007627e2;
            }
          }
          if ((instance.argumentMap.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               .arrays.groups_[uVar17].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
          ppVar14 = (value_type_pointer)((long)&local_1d0->first + 1);
          uVar17 = (long)&local_1d0->first + uVar17 + 1 &
                   instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_size_mask;
        } while (ppVar14 <=
                 instance.argumentMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_size_mask);
        ppVar20 = (value_type_pointer)0x0;
LAB_007627e2:
        range.startLoc = (SourceLocation)formal;
        unique0x10000cab = auVar8;
        local_48 = auVar25;
        if (ppVar20 == (value_type_pointer)0x0) {
          if (instance.argumentMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.size <
              instance.argumentMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                      (&res_1,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                               *)&instance.argumentMap,(arrays_type *)&instance.argumentMap,uVar11,
                       uVar15,(try_emplace_args_t *)&x,(Symbol **)&range,
                       (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       &localVars);
            instance.argumentMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.size =
                 instance.argumentMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .size_ctrl.size + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                      (&res_1,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                               *)&instance.argumentMap,uVar15,(try_emplace_args_t *)&x,
                       (Symbol **)&range,
                       (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       &localVars);
          }
        }
      }
      else {
        local_1d0 = ppVar20;
        LVar27 = LookupLocation::after(formal.t_);
        ppVar20 = local_1d0;
        res_1.n = LVar27.index;
        localVars.stackBase._16_8_ = &instance;
        stack0xfffffffffffffea0 = ZEXT816(0x2000000000);
        local_1d8 = *(PropertyExprSyntax **)(formal.t_ + 2);
        localVars.stackBase[0] = '\0';
        localVars.stackBase[1] = '\0';
        localVars.stackBase[2] = '\0';
        localVars.stackBase[3] = '\0';
        localVars.stackBase[4] = '\0';
        localVars.stackBase[5] = '\0';
        localVars.stackBase[6] = '\0';
        localVars.stackBase[7] = '\0';
        localVars.stackBase[8] = '\0';
        localVars.stackBase[9] = '\0';
        localVars.stackBase[10] = '\0';
        localVars.stackBase[0xb] = '\0';
        localVars.stackBase[0xc] = '\0';
        localVars.stackBase[0xd] = '\0';
        localVars.stackBase[0xe] = '\0';
        localVars.stackBase[0xf] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             CONCAT44(res_1._12_4_,res_1.n);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = formal;
        uVar15 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar11 = uVar15 >> ((byte)instance.argumentMap.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        uVar5 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        uVar19 = 0;
        uVar17 = uVar11;
        do {
          pgVar3 = instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_ + uVar17;
          uVar21 = (uchar)uVar5;
          auVar25[0] = -(pgVar3->m[0].n == uVar21);
          uVar22 = (uchar)((uint)uVar5 >> 8);
          auVar25[1] = -(pgVar3->m[1].n == uVar22);
          uVar23 = (uchar)((uint)uVar5 >> 0x10);
          auVar25[2] = -(pgVar3->m[2].n == uVar23);
          uVar24 = (uchar)((uint)uVar5 >> 0x18);
          auVar25[3] = -(pgVar3->m[3].n == uVar24);
          auVar25[4] = -(pgVar3->m[4].n == uVar21);
          auVar25[5] = -(pgVar3->m[5].n == uVar22);
          auVar25[6] = -(pgVar3->m[6].n == uVar23);
          auVar25[7] = -(pgVar3->m[7].n == uVar24);
          auVar25[8] = -(pgVar3->m[8].n == uVar21);
          auVar25[9] = -(pgVar3->m[9].n == uVar22);
          auVar25[10] = -(pgVar3->m[10].n == uVar23);
          auVar25[0xb] = -(pgVar3->m[0xb].n == uVar24);
          auVar25[0xc] = -(pgVar3->m[0xc].n == uVar21);
          auVar25[0xd] = -(pgVar3->m[0xd].n == uVar22);
          auVar25[0xe] = -(pgVar3->m[0xe].n == uVar23);
          auVar25[0xf] = -(pgVar3->m[0xf].n == uVar24);
          for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
              uVar18 = uVar18 - 1 & uVar18) {
            uVar7 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if ((AssertionPortSymbol *)formal.t_ ==
                (AssertionPortSymbol *)
                instance.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_[uVar17 * 0xf + (ulong)uVar7].first) {
              ppVar14 = instance.argumentMap.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                        .arrays.elements_ + uVar17 * 0xf + (ulong)uVar7;
              goto LAB_00762610;
            }
          }
          if ((instance.argumentMap.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               .arrays.groups_[uVar17].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
          lVar16 = uVar17 + uVar19;
          uVar19 = uVar19 + 1;
          uVar17 = lVar16 + 1U &
                   instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_size_mask;
        } while (uVar19 <= instance.argumentMap.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           .arrays.groups_size_mask);
        ppVar14 = (value_type_pointer)0x0;
LAB_00762610:
        localVars.stackBase._24_8_ = local_1d8;
        res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
        x.val.storage = formal;
        if (ppVar14 == (value_type_pointer)0x0) {
          localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
          if (instance.argumentMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.size <
              instance.argumentMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                      ((locator *)&range,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                        *)&instance.argumentMap,(arrays_type *)&instance.argumentMap,uVar11,uVar15,
                       &local_1e9,(Symbol **)&x,
                       (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       &localVars);
            instance.argumentMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.size =
                 instance.argumentMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .size_ctrl.size + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                      ((locator *)&range,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                        *)&instance.argumentMap,uVar15,&local_1e9,(Symbol **)&x,
                       (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                       &localVars);
          }
        }
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)0x0;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len & 0xffffffffffffff00;
        checkAssertionArg(local_1d8,(AssertionPortSymbol *)formal.t_,(ASTContext *)&res_1,
                          (ActualArg *)&localVars,false);
      }
      if (((((ulong)local_1e8 & 0xfffffff) == 0) &&
          ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)&formal.t_[2].name._M_len)
           ->_M_payload).super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged ==
           true)) &&
         ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)&formal.t_[2].name._M_len)
          ->_M_payload).super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
          _M_value - Out < 2)) {
        local_1e8 = (formal.t_)->location;
      }
      poVar13 = poVar13 + 1;
      ppVar14 = instance.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_;
    } while (poVar13 != poVar2);
  }
  instance.argumentMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  .arrays.elements_ = ppVar14;
  res_1.n = 0xffffffff;
  stack0xfffffffffffffea0 = (undefined1  [16])0x0;
  if (symbol->kind == LetDecl) {
    res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
    pAVar12 = (AssertionInstanceExpression *)
              Expression::create(this,(ExpressionSyntax *)symbol[2].name._M_len,(ASTContext *)&res_1
                                 ,(bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
  }
  else {
    pcVar4 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pcVar4;
    res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
    args_2 = bindAssertionBody(symbol,symbol->originatingSyntax,(ASTContext *)&res_1,local_1e8,
                               &instance,
                               &localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>);
    range.startLoc = symbol->location;
    range.endLoc = (SourceLocation)
                   ((long)range.startLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                   (ulong)(range.startLoc._0_4_ & 0xfffffff));
    x.val.storage.t_ = x.val.storage.t_ & 0xffffffffffffff00;
    pAVar12 = BumpAllocator::
              emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                        (&this->super_BumpAllocator,local_1e0,symbol,args_2,(bool *)&x,&range);
    iVar10 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                       (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                        (EVP_PKEY_CTX *)this,src);
    (pAVar12->localVars)._M_ptr = (pointer)CONCAT44(extraout_var,iVar10);
    (pAVar12->localVars)._M_extent._M_extent_value = extraout_RDX;
    if (localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ != (pointer)pcVar4) {
      operator_delete(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_);
    }
  }
  if (instance.localVars.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(instance.localVars.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .arrays.elements_,
                    ((instance.localVars.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                      .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
  }
  if (instance.argumentMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
      .arrays.elements_ != (value_type_pointer)0x0) {
    operator_delete(instance.argumentMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .arrays.elements_,
                    ((instance.argumentMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      .arrays.groups_size_mask * 0x448 + 0x456) / 9 & 0xfffffffffffffff8) * 9);
  }
  return &pAVar12->super_Expression;
}

Assistant:

Expression& AssertionInstanceExpression::makeDefault(const Symbol& symbol) {
    auto parentScope = symbol.getParentScope();
    SLANG_ASSERT(parentScope);

    ASTContext context(*parentScope, LookupLocation::before(symbol));
    auto& comp = context.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = symbol.location;

    // Bind default args, make placeholder entries for args that don't have defaults.
    SourceLocation outputLocalVarArgLoc;
    for (auto formal : formalPorts) {
        if (!formal->defaultValueSyntax) {
            instance.argumentMap.emplace(formal,
                                         std::make_tuple((PropertyExprSyntax*)nullptr, context));
        }
        else {
            ASTContext ctx(*symbolScope, LookupLocation::after(*formal));
            ctx.assertionInstance = &instance;
            ctx.flags |= ASTFlags::AssertionDefaultArg;

            auto expr = formal->defaultValueSyntax;
            instance.argumentMap.emplace(formal, std::make_tuple(expr, ctx));

            ActualArg arg;
            checkAssertionArg(*expr, *formal, ctx, arg, false);
        }

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    SourceRange range{symbol.location, symbol.location + 1};
    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->localVars = localVars.copy(comp);
    return *result;
}